

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O0

int GetMultReg(char *oper,int loc)

{
  bool bVar1;
  int iVar2;
  uint local_44;
  int multext;
  int range;
  int t2;
  int t1;
  int j;
  char *t;
  char *s;
  int loc_local;
  char *oper_local;
  
  local_44 = 0;
  bVar1 = false;
  iVar2 = IsOperator(oper);
  t = oper;
  if (iVar2 == 0) {
    do {
      for (_t1 = t; ((*_t1 != '\0' && (*_t1 != '-')) && (*_t1 != '/')); _t1 = _t1 + 1) {
      }
      if ((local_44 == 0) && (*_t1 == '\0')) {
        return 0;
      }
      iVar2 = IsRegister(t,(int)_t1 - (int)t);
      if (iVar2 < 0) {
        return 0;
      }
      if (bVar1) {
        bVar1 = false;
        multext = iVar2;
        if (iVar2 < range) {
          multext = range;
          range = iVar2;
        }
        for (t2 = range; t2 <= multext; t2 = t2 + 1) {
          local_44 = 1 << ((byte)t2 & 0x1f) | local_44;
        }
        if (*_t1 == '-') {
          return 0;
        }
      }
      else {
        local_44 = 1 << ((byte)iVar2 & 0x1f) | local_44;
        range = iVar2;
      }
      if (*_t1 == '\0') {
        return local_44;
      }
      t = _t1 + 1;
      if (*_t1 == '-') {
        bVar1 = true;
      }
    } while (*t != '\0');
  }
  return 0;
}

Assistant:

int 
GetMultReg (char *oper, int loc)
/* Builds a register mask for the MOVEM instruction.
 Returns the mask in the low-order portion of its value if
 "oper" is a valid multiple-register list; otherwise returns 0. */
{
	register char *s, *t;
	register int j;
	int t1, t2; /* Temporary variables for registers */
	int range; /* We're processing a range of registers. */
	int multext; /* The result is built here. */

	multext = 0;
	range = FALSE;
	s = oper;
	if (IsOperator(s))
		return (0); /* Starts with an operator! */

	while (1) {
		for (t = s; *t; t++) {
			if ((*t == '-') || (*t == '/')) {
				break;
			}
		}
		if ((multext == 0) && (*t == '\0'))
			return (0); /* Reject single term. */
		if ((t2 = IsRegister(s, (int) (t - s))) < 0)
			return (0); /* Not a recognizable register */

		if (!range) {
			multext |= (1 << t2); /* Single register */
			t1 = t2; /* Save number in case it's a range. */
		} else { /* Range of registers */
			range = FALSE;
			if (t1 > t2) {
				j = t1; /* Swap registers if backwards. */
				t1 = t2;
				t2 = j;
			}
			for (j = t1; j <= t2; j++)
				multext |= (1 << j); /* Mark all registers in range. */
			if (*t == '-')
				return (0); /* Invalid range */
		}
		if (*t == '\0')
			break; /* Normal end of operand */
		if (*t++ == '-')
			range = TRUE; /* Range indicator */
		if (*t == '\0')
			return (0); /* Premature end of operand */
		s = t;
	}
	return (multext);
}